

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifReduce.c
# Opt level: O3

int If_ManImproveNodeFaninCompact0
              (If_Man_t *p,If_Obj_t *pObj,int nLimit,Vec_Ptr_t *vFront,Vec_Ptr_t *vVisited)

{
  If_Obj_t *pObj_00;
  int iVar1;
  long lVar2;
  
  if (vFront->nSize < 1) {
    return 0;
  }
  lVar2 = 0;
  while (((pObj_00 = (If_Obj_t *)vFront->pArray[lVar2],
          ((undefined1  [112])*pObj_00 & (undefined1  [112])0xf) == (undefined1  [112])0x2 ||
          (iVar1 = If_ManImproveNodeWillGrow(p,pObj_00), iVar1 != 0)) ||
         (iVar1 = If_ManImproveNodeFaninCost(p,pObj_00), 0 < iVar1))) {
    lVar2 = lVar2 + 1;
    if (vFront->nSize <= lVar2) {
      return 0;
    }
  }
  If_ManImproveNodeFaninUpdate(p,pObj_00,vFront,vVisited);
  return 1;
}

Assistant:

int If_ManImproveNodeFaninCompact0( If_Man_t * p, If_Obj_t * pObj, int nLimit, Vec_Ptr_t * vFront, Vec_Ptr_t * vVisited )
{
    If_Obj_t * pFanin;
    int i;
    Vec_PtrForEachEntry( If_Obj_t *, vFront, pFanin, i )
    {
        if ( If_ObjIsCi(pFanin) )
            continue;
        if ( If_ManImproveNodeWillGrow(p, pFanin) )
            continue;
        if ( If_ManImproveNodeFaninCost(p, pFanin) <= 0 )
        {
            If_ManImproveNodeFaninUpdate( p, pFanin, vFront, vVisited );
            return 1;
        }
    }
    return 0;
}